

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateNotImplementedMethods
          (ServiceGenerator *this,Printer *printer)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  DescriptorStringView value;
  cpp *pcVar4;
  Options *options;
  Sub *local_3c0;
  basic_string_view<char,_std::char_traits<char>_> local_358;
  undefined1 local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_299;
  string local_298;
  Sub *local_278;
  Sub local_270;
  Sub local_1b8;
  Sub local_100;
  iterator local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  undefined1 local_28 [8];
  MethodDescriptor *method;
  undefined8 uStack_18;
  int i;
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  method._4_4_ = 0;
  uStack_18 = printer;
  printer_local = (Printer *)this;
  while( true ) {
    iVar1 = method._4_4_;
    uVar3 = ServiceDescriptor::method_count(this->descriptor_);
    options = (Options *)(ulong)uVar3;
    if ((int)uVar3 <= iVar1) break;
    local_28 = (undefined1  [8])ServiceDescriptor::method(this->descriptor_,method._4_4_);
    uVar2 = uStack_18;
    local_341 = 1;
    local_278 = &local_270;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"name",&local_299);
    value = MethodDescriptor::name_abi_cxx11_((MethodDescriptor *)local_28);
    io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_270,&local_298,value);
    local_278 = &local_1b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"input",&local_2d1);
    pcVar4 = (cpp *)google::protobuf::MethodDescriptor::input_type();
    QualifiedClassName_abi_cxx11_(&local_2f8,pcVar4,(Descriptor *)this->options_,options);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_1b8,&local_2d0,&local_2f8);
    local_278 = &local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"output",&local_319);
    pcVar4 = (cpp *)google::protobuf::MethodDescriptor::output_type();
    QualifiedClassName_abi_cxx11_(&local_340,pcVar4,(Descriptor *)this->options_,options);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_100,&local_318,&local_340);
    local_341 = 0;
    local_48 = &local_270;
    local_40 = 3;
    v._M_len = 3;
    v._M_array = local_48;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_38._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_358,
               "\n          void $classname$::$name$(::$proto_ns$::RpcController* controller,\n                                   const $input$*, $output$*, ::google::protobuf::Closure* done) {\n            controller->SetFailed(\"Method $name$() not implemented.\");\n            done->Run();\n          }\n        "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (uVar2,local_38._M_allocated_capacity,local_38._8_8_,local_358._M_len,local_358._M_str
              );
    local_3c0 = (Sub *)&local_48;
    do {
      local_3c0 = local_3c0 + -1;
      io::Printer::Sub::~Sub(local_3c0);
    } while (local_3c0 != &local_270);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    method._4_4_ = method._4_4_ + 1;
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateNotImplementedMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);

    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
        },
        R"cc(
          void $classname$::$name$(::$proto_ns$::RpcController* controller,
                                   const $input$*, $output$*, ::google::protobuf::Closure* done) {
            controller->SetFailed("Method $name$() not implemented.");
            done->Run();
          }
        )cc");
  }
}